

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unparser.cc
# Opt level: O0

Status __thiscall
google::protobuf::json_internal::anon_unknown_4::
WriteRepeated<google::protobuf::json_internal::UnparseProto2Descriptor>
          (anon_unknown_4 *this,JsonWriter *writer,
          Msg<google::protobuf::json_internal::UnparseProto2Descriptor> *msg,
          Field<google::protobuf::json_internal::UnparseProto2Descriptor> field)

{
  anon_class_32_4_f6e7cdfc body;
  Msg<google::protobuf::json_internal::UnparseProto2Descriptor> *this_00;
  bool bVar1;
  MessageType MVar2;
  string_view name;
  string_view local_b0;
  byte local_99;
  uint local_98;
  Field<google::protobuf::json_internal::UnparseProto2Descriptor> *local_88;
  Field<google::protobuf::json_internal::UnparseProto2Descriptor> pFStack_80;
  unsigned_long *local_78;
  bool *pbStack_70;
  byte local_62;
  bool local_61;
  undefined1 auStack_60 [7];
  bool empty;
  unsigned_long local_50;
  size_t i;
  size_t sStack_40;
  bool first;
  size_t count;
  Field<google::protobuf::json_internal::UnparseProto2Descriptor> local_28;
  Field<google::protobuf::json_internal::UnparseProto2Descriptor> field_local;
  Msg<google::protobuf::json_internal::UnparseProto2Descriptor> *msg_local;
  JsonWriter *writer_local;
  Status *_status;
  
  local_28 = field;
  field_local = (Field<google::protobuf::json_internal::UnparseProto2Descriptor>)msg;
  msg_local = (Msg<google::protobuf::json_internal::UnparseProto2Descriptor> *)writer;
  writer_local = (JsonWriter *)this;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)&count,"[");
  JsonWriter::Write(writer,_count);
  JsonWriter::Push((JsonWriter *)msg_local);
  sStack_40 = UnparseProto2Descriptor::GetSize(local_28,(Msg *)field_local);
  i._7_1_ = 1;
  local_50 = 0;
  do {
    if (sStack_40 <= local_50) {
      JsonWriter::Pop((JsonWriter *)msg_local);
      if ((i._7_1_ & 1) == 0) {
        JsonWriter::NewLine((JsonWriter *)msg_local);
      }
      this_00 = msg_local;
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_b0,"]");
      JsonWriter::Write((JsonWriter *)this_00,local_b0);
      absl::lts_20240722::OkStatus();
      return (Status)(uintptr_t)this;
    }
    _auStack_60 = Proto2Descriptor::FieldTypeName(local_28);
    name._M_str = auStack_60._8_8_;
    name._M_len = (size_t)name._M_str;
    MVar2 = ClassifyMessage(_auStack_60,name);
    if (MVar2 == kValue) {
      local_61 = false;
      local_62 = 0;
      local_88 = &local_28;
      pFStack_80 = field_local;
      local_78 = &local_50;
      pbStack_70 = &local_61;
      body.msg = (Msg<google::protobuf::json_internal::UnparseProto2Descriptor> *)field_local;
      body.field = local_88;
      body.i = local_78;
      body.empty = pbStack_70;
      Proto2Descriptor::
      WithFieldType<google::protobuf::json_internal::(anonymous_namespace)::WriteRepeated<google::protobuf::json_internal::UnparseProto2Descriptor>(google::protobuf::json_internal::JsonWriter&,google::protobuf::json_internal::UnparseProto2Descriptor::Msg_const&,google::protobuf::json_internal::UnparseProto2Descriptor::Field)::_lambda(google::protobuf::Descriptor_const&)_1_>
                ((Field)this,body);
      bVar1 = absl::lts_20240722::Status::ok((Status *)this);
      bVar1 = ((bVar1 ^ 0xffU) & 1) != 0;
      if (bVar1) {
        local_62 = 1;
      }
      local_98 = (uint)bVar1;
      if ((local_62 & 1) == 0) {
        absl::lts_20240722::Status::~Status((Status *)this);
      }
      if (local_98 != 0) {
        return (Status)(uintptr_t)this;
      }
      if ((local_61 & 1U) == 0) goto LAB_004d9f71;
    }
    else {
LAB_004d9f71:
      JsonWriter::WriteComma((JsonWriter *)msg_local,(bool *)((long)&i + 7));
      JsonWriter::NewLine((JsonWriter *)msg_local);
      local_99 = 0;
      (anonymous_namespace)::
      WriteSingular<google::protobuf::json_internal::UnparseProto2Descriptor,google::protobuf::Message_const&,unsigned_long&>
                ((_anonymous_namespace_ *)this,(JsonWriter *)msg_local,local_28,
                 (Message *)field_local,&local_50);
      bVar1 = absl::lts_20240722::Status::ok((Status *)this);
      bVar1 = ((bVar1 ^ 0xffU) & 1) != 0;
      if (bVar1) {
        local_99 = 1;
      }
      local_98 = (uint)bVar1;
      if ((local_99 & 1) == 0) {
        absl::lts_20240722::Status::~Status((Status *)this);
      }
      if (local_98 != 0) {
        return (Status)(uintptr_t)this;
      }
    }
    local_50 = local_50 + 1;
  } while( true );
}

Assistant:

absl::Status WriteRepeated(JsonWriter& writer, const Msg<Traits>& msg,
                           Field<Traits> field) {
  writer.Write("[");
  writer.Push();

  size_t count = Traits::GetSize(field, msg);
  bool first = true;
  for (size_t i = 0; i < count; ++i) {
    if (ClassifyMessage(Traits::FieldTypeName(field)) == MessageType::kValue) {
      bool empty = false;
      RETURN_IF_ERROR(Traits::WithFieldType(
          field, [&](const Desc<Traits>& desc) -> absl::Status {
            auto inner = Traits::GetMessage(field, msg, i);
            RETURN_IF_ERROR(inner.status());
            empty = IsEmpty<Traits>(**inner, desc);
            return absl::OkStatus();
          }));

      // Empty google.protobuf.Values are silently discarded.
      if (empty) {
        continue;
      }
    }
    writer.WriteComma(first);
    writer.NewLine();
    RETURN_IF_ERROR(WriteSingular<Traits>(writer, field, msg, i));
  }

  writer.Pop();
  if (!first) {
    writer.NewLine();
  }
  writer.Write("]");
  return absl::OkStatus();
}